

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

void __thiscall
Rml::PropertySpecification::ParsePropertyValues
          (PropertySpecification *this,StringList *values_list,String *values,
          SplitOption split_option)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  String local_90;
  char local_69;
  ulong uStack_68;
  char character;
  size_t character_index;
  int open_parentheses;
  ParseState state;
  anon_class_16_2_d6396173 SubmitValue;
  String value;
  bool split_by_whitespace;
  bool split_by_comma;
  bool split_values;
  SplitOption split_option_local;
  String *values_local;
  StringList *values_list_local;
  PropertySpecification *this_local;
  
  bVar6 = split_option == Comma;
  ::std::__cxx11::string::string((string *)&SubmitValue.values_list);
  _open_parentheses = (String *)&SubmitValue.values_list;
  character_index._4_4_ = 0;
  character_index._0_4_ = 0;
  uStack_68 = 0;
  SubmitValue.value = (String *)values_list;
  do {
    uVar1 = uStack_68;
    uVar3 = ::std::__cxx11::string::size();
    if (uVar3 <= uVar1) {
      if (character_index._4_4_ == 0) {
        ParsePropertyValues::anon_class_16_2_d6396173::operator()
                  ((anon_class_16_2_d6396173 *)&open_parentheses);
      }
      ::std::__cxx11::string::~string((string *)&SubmitValue.values_list);
      return;
    }
    pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)values);
    local_69 = *pcVar4;
    uStack_68 = uStack_68 + 1;
    switch(character_index._4_4_) {
    case 0:
      if (local_69 == ';') {
        StringUtilities::StripWhitespace(&local_90,(String *)&SubmitValue.values_list);
        ::std::__cxx11::string::operator=((string *)&SubmitValue.values_list,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        lVar5 = ::std::__cxx11::string::size();
        if (lVar5 != 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)values_list,(value_type *)&SubmitValue.values_list);
          ::std::__cxx11::string::clear();
        }
        break;
      }
      if (bVar6) {
        if (local_69 != ',') {
LAB_005fa505:
          if (local_69 == '\"') {
            character_index._4_4_ = 2;
            if (split_option != Whitespace) {
              ::std::__cxx11::string::operator+=
                        ((string *)&SubmitValue.values_list,bVar6 * '\x02' + ' ');
            }
            else {
              ParsePropertyValues::anon_class_16_2_d6396173::operator()
                        ((anon_class_16_2_d6396173 *)&open_parentheses);
            }
          }
          else if (local_69 == '(') {
            character_index._0_4_ = 1;
            ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,'(');
            character_index._4_4_ = 1;
          }
          else {
            ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
          }
          break;
        }
      }
      else {
        bVar2 = StringUtilities::IsWhitespace(local_69);
        if (!bVar2) goto LAB_005fa505;
      }
      if (split_option == None) {
        ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
      }
      else {
        ParsePropertyValues::anon_class_16_2_d6396173::operator()
                  ((anon_class_16_2_d6396173 *)&open_parentheses);
      }
      break;
    case 1:
      if (local_69 == '(') {
        character_index._0_4_ = (int)character_index + 1;
      }
      else if (local_69 == ')') {
        character_index._0_4_ = (int)character_index + -1;
        if ((int)character_index == 0) {
          character_index._4_4_ = 0;
        }
      }
      else if (local_69 == '\"') {
        character_index._4_4_ = 2;
      }
      ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
      break;
    case 2:
      if (local_69 == '\"') {
        if ((int)character_index == 0) {
          character_index._4_4_ = 0;
          if (split_option != Whitespace) {
            ::std::__cxx11::string::operator+=
                      ((string *)&SubmitValue.values_list,bVar6 * '\x02' + ' ');
          }
          else {
            ParsePropertyValues::anon_class_16_2_d6396173::operator()
                      ((anon_class_16_2_d6396173 *)&open_parentheses);
          }
        }
        else {
          character_index._4_4_ = 1;
          ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,'\"');
        }
      }
      else if (local_69 == '\\') {
        character_index._4_4_ = 3;
      }
      else {
        ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
      }
      break;
    case 3:
      if ((local_69 == '\"') || (local_69 == '\\')) {
        ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
      }
      else {
        ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,'\\');
        ::std::__cxx11::string::operator+=((string *)&SubmitValue.values_list,local_69);
      }
      character_index._4_4_ = 2;
    }
  } while( true );
}

Assistant:

void PropertySpecification::ParsePropertyValues(StringList& values_list, const String& values, const SplitOption split_option) const
{
	const bool split_values = (split_option != SplitOption::None);
	const bool split_by_comma = (split_option == SplitOption::Comma);
	const bool split_by_whitespace = (split_option == SplitOption::Whitespace);

	String value;

	auto SubmitValue = [&]() {
		value = StringUtilities::StripWhitespace(value);
		if (value.size() > 0)
		{
			values_list.push_back(value);
			value.clear();
		}
	};

	enum ParseState { VALUE, VALUE_PARENTHESIS, VALUE_QUOTE, VALUE_QUOTE_ESCAPE_NEXT };
	ParseState state = VALUE;
	int open_parentheses = 0;
	size_t character_index = 0;

	while (character_index < values.size())
	{
		const char character = values[character_index];
		character_index++;

		switch (state)
		{
		case VALUE:
		{
			if (character == ';')
			{
				value = StringUtilities::StripWhitespace(value);
				if (value.size() > 0)
				{
					values_list.push_back(value);
					value.clear();
				}
			}
			else if (split_by_comma ? (character == ',') : StringUtilities::IsWhitespace(character))
			{
				if (split_values)
					SubmitValue();
				else
					value += character;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
				if (split_by_whitespace)
					SubmitValue();
				else
					value += (split_by_comma ? '"' : ' ');
			}
			else if (character == '(')
			{
				open_parentheses = 1;
				value += character;
				state = VALUE_PARENTHESIS;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_PARENTHESIS:
		{
			if (character == '(')
			{
				open_parentheses++;
			}
			else if (character == ')')
			{
				open_parentheses--;
				if (open_parentheses == 0)
					state = VALUE;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
			}

			value += character;
		}
		break;
		case VALUE_QUOTE:
		{
			if (character == '"')
			{
				if (open_parentheses == 0)
				{
					state = VALUE;
					if (split_by_whitespace)
						SubmitValue();
					else
						value += (split_by_comma ? '"' : ' ');
				}
				else
				{
					state = VALUE_PARENTHESIS;
					value += character;
				}
			}
			else if (character == '\\')
			{
				state = VALUE_QUOTE_ESCAPE_NEXT;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_QUOTE_ESCAPE_NEXT:
		{
			if (character == '"' || character == '\\')
			{
				value += character;
			}
			else
			{
				value += '\\';
				value += character;
			}
			state = VALUE_QUOTE;
		}
		break;
		}
	}

	if (state == VALUE)
		SubmitValue();
}